

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O3

reference __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
map_function::evaluate
          (map_function *this,
          vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          *args,eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *context,error_code *ec)

{
  pointer ppVar1;
  expression_type *peVar2;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this_00;
  int iVar3;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar4;
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *pbVar5;
  iterator iVar6;
  undefined4 extraout_var;
  reference pbVar7;
  assertion_error *this_01;
  uint uVar8;
  const_array_range_type cVar9;
  string local_50;
  
  ppVar1 = (args->
           super__Vector_base<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 4 !=
      (this->
      super_function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
      ).arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value) {
    this_01 = (assertion_error *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"assertion \'args.size() == *this->arity()\' failed at  <> :0",""
              );
    assertion_error::assertion_error(this_01,&local_50);
    __cxa_throw(this_01,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((ppVar1->type_ == expression) && (ppVar1[1].type_ == value)) {
    peVar2 = (ppVar1->field_1).expression_;
    this_00 = ppVar1[1].field_1.value_;
    pbVar4 = this_00;
    while (uVar8 = *(byte *)&pbVar4->field_0 & 0xf, uVar8 - 8 < 2) {
      pbVar4 = *(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **)
                ((long)&(pbVar4->field_0).int64_ + 8);
    }
    if (uVar8 == 0xe) {
      pbVar5 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)
               eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
               ::create_json<jsoncons::json_array_arg_t_const&>
                         ((eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                           *)context,(json_array_arg_t *)&json_array_arg);
      cVar9 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range(this_00)
      ;
      iVar6 = cVar9.first_._M_current;
      while( true ) {
        if (iVar6._M_current == cVar9.last_._M_current._M_current) {
          return (reference)pbVar5;
        }
        iVar3 = (*peVar2->_vptr_expr_base[2])(peVar2,iVar6._M_current,context,ec);
        if (ec->_M_value != 0) break;
        local_50._M_dataplus._M_p = (pointer)CONCAT44(extraout_var,iVar3);
        basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
        emplace_back<jsoncons::json_const_pointer_arg_t_const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const*>
                  (pbVar5,(json_const_pointer_arg_t *)&json_const_pointer_arg,
                   (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **)&local_50);
        iVar6._M_current = iVar6._M_current + 1;
      }
      std::error_code::operator=(ec,invalid_type);
      pbVar5 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)
               eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
               ::null_value(context);
      return (reference)pbVar5;
    }
  }
  std::error_code::operator=(ec,invalid_type);
  pbVar7 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           ::null_value(context);
  return pbVar7;
}

Assistant:

reference evaluate(const std::vector<parameter_type>& args, eval_context<Json>& context, std::error_code& ec) const override
            {
                JSONCONS_ASSERT(args.size() == *this->arity());

                if (!(args[0].is_expression() && args[1].is_value()))
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }
                const auto& expr = args[0].expression();

                reference arg0 = args[1].value();
                if (!arg0.is_array())
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }

                auto result = context.create_json(json_array_arg);

                for (auto& item : arg0.array_range())
                {
                    auto& j = expr.evaluate(item, context, ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        ec = jmespath_errc::invalid_type;
                        return context.null_value();
                    }
                    result->emplace_back(json_const_pointer_arg, std::addressof(j));
                }

                return *result;
            }